

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void updateAccumulator(Parse *pParse,int regAcc,AggInfo *pAggInfo,int eDistinctType)

{
  Vdbe *p;
  Expr *pEVar1;
  ExprList *pList;
  ExprList *pList_00;
  int iVar2;
  CollSeq *zP4;
  int iVar3;
  int iVar4;
  ExprList_item *pEVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int p1;
  int iVar9;
  AggInfo_func *pAVar10;
  Expr **ppEVar11;
  bool bVar12;
  int local_6c;
  int local_68;
  
  if (pParse->nErr != 0) {
    return;
  }
  p = pParse->pVdbe;
  pAggInfo->directMode = '\x01';
  pAVar10 = pAggInfo->aFunc;
  local_6c = 0;
  for (iVar4 = 0; iVar4 < pAggInfo->nFunc; iVar4 = iVar4 + 1) {
    pEVar1 = pAVar10->pFExpr;
    pList = (pEVar1->x).pList;
    if ((pEVar1->flags & 0x1000000) == 0) {
      local_68 = 0;
    }
    else {
      pEVar1 = ((pEVar1->y).pWin)->pFilter;
      if (((pAggInfo->nAccumulator != 0) && (regAcc != 0)) &&
         ((pAVar10->pFunc->funcFlags & 0x20) != 0)) {
        if (local_6c == 0) {
          local_6c = pParse->nMem + 1;
          pParse->nMem = local_6c;
        }
        sqlite3VdbeAddOp2(p,0x50,regAcc,local_6c);
      }
      local_68 = pParse->nLabel + -1;
      pParse->nLabel = local_68;
      sqlite3ExprIfFalse(pParse,pEVar1,local_68,0x10);
    }
    if (pAVar10->iOBTab < 0) {
      if (pList == (ExprList *)0x0) {
        iVar3 = 0;
        iVar2 = 0;
        iVar6 = 0;
        iVar8 = 0;
      }
      else {
        iVar3 = pList->nExpr;
        iVar8 = sqlite3GetTempRange(pParse,iVar3);
        iVar6 = 0;
        sqlite3ExprCodeExprList(pParse,pList,iVar8,0,'\x01');
        iVar2 = iVar8;
      }
    }
    else {
      iVar3 = pList->nExpr;
      iVar6 = iVar3;
      if (pAVar10->bOBPayload == '\0') {
        iVar6 = 0;
      }
      pList_00 = (pAVar10->pFExpr->pLeft->x).pList;
      iVar2 = iVar3;
      if (pAVar10->bUseSubtype == '\0') {
        iVar2 = 0;
      }
      iVar6 = iVar6 + pList_00->nExpr + (uint)(pAVar10->bOBUnique == '\0') + iVar2 + 1;
      iVar2 = sqlite3GetTempRange(pParse,iVar6);
      sqlite3ExprCodeExprList(pParse,pList_00,iVar2,0,'\x01');
      iVar7 = pList_00->nExpr;
      if (pAVar10->bOBUnique == '\0') {
        sqlite3VdbeAddOp2(p,0x7e,pAVar10->iOBTab,iVar7 + iVar2);
        iVar7 = iVar7 + 1;
      }
      iVar8 = iVar2;
      if (pAVar10->bOBPayload != '\0') {
        iVar8 = iVar7 + iVar2;
        sqlite3ExprCodeExprList(pParse,pList,iVar8,0,'\x01');
        iVar7 = iVar7 + iVar3;
      }
      if (pAVar10->bUseSubtype != '\0') {
        p1 = iVar8;
        if (pAVar10->bOBPayload == '\0') {
          p1 = iVar2;
        }
        iVar9 = 0;
        if (0 < iVar3) {
          iVar9 = iVar3;
        }
        iVar7 = iVar7 + iVar2;
        while (bVar12 = iVar9 != 0, iVar9 = iVar9 + -1, bVar12) {
          sqlite3VdbeAddOp2(p,0xb5,p1,iVar7);
          iVar7 = iVar7 + 1;
          p1 = p1 + 1;
        }
      }
    }
    iVar7 = pAVar10->iDistinct;
    if (pList != (ExprList *)0x0 && -1 < iVar7) {
      if (local_68 == 0) {
        local_68 = pParse->nLabel + -1;
        pParse->nLabel = local_68;
      }
      iVar8 = codeDistinct(pParse,eDistinctType,iVar7,local_68,pList,iVar8);
      pAVar10->iDistinct = iVar8;
    }
    if (pAVar10->iOBTab < 0) {
      if ((pAVar10->pFunc->funcFlags & 0x20) != 0) {
        pEVar5 = pList->a;
        zP4 = (CollSeq *)0x0;
        for (iVar6 = 0; (zP4 == (CollSeq *)0x0 && (iVar6 < iVar3)); iVar6 = iVar6 + 1) {
          zP4 = sqlite3ExprCollSeq(pParse,pEVar5->pExpr);
          pEVar5 = pEVar5 + 1;
        }
        if (zP4 == (CollSeq *)0x0) {
          zP4 = pParse->db->pDfltColl;
        }
        if (local_6c == 0) {
          if (pAggInfo->nAccumulator == 0) {
            local_6c = 0;
          }
          else {
            local_6c = pParse->nMem + 1;
            pParse->nMem = local_6c;
          }
        }
        sqlite3VdbeAddOp4(p,0x55,local_6c,0,0,(char *)zP4,-2);
      }
      sqlite3VdbeAddOp3(p,0xa2,0,iVar2,pAggInfo->iFirstReg + iVar4 + pAggInfo->nColumn);
      sqlite3VdbeAppendP4(p,pAVar10->pFunc,-7);
      if (0 < (long)p->nOp) {
        p->aOp[(long)p->nOp + -1].p5 = (u16)iVar3;
      }
    }
    else {
      iVar3 = iVar6 + iVar2 + -1;
      sqlite3VdbeAddOp3(p,0x61,iVar2,iVar6 + -1,iVar3);
      sqlite3VdbeAddOp4Int(p,0x8a,pAVar10->iOBTab,iVar3,iVar2,iVar6 + -1);
      iVar3 = iVar6;
    }
    sqlite3ReleaseTempRange(pParse,iVar2,iVar3);
    if (local_68 != 0) {
      sqlite3VdbeResolveLabel(p,local_68);
    }
    if (pParse->nErr != 0) {
      return;
    }
    pAVar10 = pAVar10 + 1;
  }
  if (local_6c == 0) {
    iVar4 = 0;
    if ((regAcc == 0) || (local_6c = regAcc, iVar4 = 0, pAggInfo->nAccumulator == 0))
    goto LAB_00184a02;
  }
  iVar4 = sqlite3VdbeAddOp1(p,0x10,local_6c);
LAB_00184a02:
  ppEVar11 = &pAggInfo->aCol->pCExpr;
  for (iVar3 = 0; iVar3 < pAggInfo->nAccumulator; iVar3 = iVar3 + 1) {
    sqlite3ExprCode(pParse,*ppEVar11,pAggInfo->iFirstReg + iVar3);
    if (pParse->nErr != 0) {
      return;
    }
    ppEVar11 = ppEVar11 + 3;
  }
  pAggInfo->directMode = '\0';
  if (iVar4 == 0) {
    return;
  }
  sqlite3VdbeJumpHereOrPopInst(p,iVar4);
  return;
}

Assistant:

static void updateAccumulator(
  Parse *pParse,
  int regAcc,
  AggInfo *pAggInfo,
  int eDistinctType
){
  Vdbe *v = pParse->pVdbe;
  int i;
  int regHit = 0;
  int addrHitTest = 0;
  struct AggInfo_func *pF;
  struct AggInfo_col *pC;

  assert( pAggInfo->iFirstReg>0 );
  if( pParse->nErr ) return;
  pAggInfo->directMode = 1;
  for(i=0, pF=pAggInfo->aFunc; i<pAggInfo->nFunc; i++, pF++){
    int nArg;
    int addrNext = 0;
    int regAgg;
    int regAggSz = 0;
    int regDistinct = 0;
    ExprList *pList;
    assert( ExprUseXList(pF->pFExpr) );
    assert( !IsWindowFunc(pF->pFExpr) );
    assert( pF->pFunc!=0 );
    pList = pF->pFExpr->x.pList;
    if( ExprHasProperty(pF->pFExpr, EP_WinFunc) ){
      Expr *pFilter = pF->pFExpr->y.pWin->pFilter;
      if( pAggInfo->nAccumulator
       && (pF->pFunc->funcFlags & SQLITE_FUNC_NEEDCOLL)
       && regAcc
      ){
        /* If regAcc==0, there there exists some min() or max() function
        ** without a FILTER clause that will ensure the magnet registers
        ** are populated. */
        if( regHit==0 ) regHit = ++pParse->nMem;
        /* If this is the first row of the group (regAcc contains 0), clear the
        ** "magnet" register regHit so that the accumulator registers
        ** are populated if the FILTER clause jumps over the the
        ** invocation of min() or max() altogether. Or, if this is not
        ** the first row (regAcc contains 1), set the magnet register so that
        ** the accumulators are not populated unless the min()/max() is invoked
        ** and indicates that they should be.  */
        sqlite3VdbeAddOp2(v, OP_Copy, regAcc, regHit);
      }
      addrNext = sqlite3VdbeMakeLabel(pParse);
      sqlite3ExprIfFalse(pParse, pFilter, addrNext, SQLITE_JUMPIFNULL);
    }
    if( pF->iOBTab>=0 ){
      /* Instead of invoking AggStep, we must push the arguments that would
      ** have been passed to AggStep onto the sorting table. */
      int jj;                /* Registered used so far in building the record */
      ExprList *pOBList;     /* The ORDER BY clause */
      assert( pList!=0 );
      nArg = pList->nExpr;
      assert( nArg>0 );
      assert( pF->pFExpr->pLeft!=0 );
      assert( pF->pFExpr->pLeft->op==TK_ORDER );
      assert( ExprUseXList(pF->pFExpr->pLeft) );
      pOBList = pF->pFExpr->pLeft->x.pList;
      assert( pOBList!=0 );
      assert( pOBList->nExpr>0 );
      regAggSz = pOBList->nExpr;
      if( !pF->bOBUnique ){
        regAggSz++;   /* One register for OP_Sequence */
      }
      if( pF->bOBPayload ){
        regAggSz += nArg;
      }
      if( pF->bUseSubtype ){
        regAggSz += nArg;
      }
      regAggSz++;  /* One extra register to hold result of MakeRecord */
      regAgg = sqlite3GetTempRange(pParse, regAggSz);
      regDistinct = regAgg;
      sqlite3ExprCodeExprList(pParse, pOBList, regAgg, 0, SQLITE_ECEL_DUP);
      jj = pOBList->nExpr;
      if( !pF->bOBUnique ){
        sqlite3VdbeAddOp2(v, OP_Sequence, pF->iOBTab, regAgg+jj);
        jj++;
      }
      if( pF->bOBPayload ){
        regDistinct = regAgg+jj;
        sqlite3ExprCodeExprList(pParse, pList, regDistinct, 0, SQLITE_ECEL_DUP);
        jj += nArg;
      }
      if( pF->bUseSubtype ){
        int kk;
        int regBase = pF->bOBPayload ? regDistinct : regAgg;
        for(kk=0; kk<nArg; kk++, jj++){
          sqlite3VdbeAddOp2(v, OP_GetSubtype, regBase+kk, regAgg+jj);
        }
      }
    }else if( pList ){
      nArg = pList->nExpr;
      regAgg = sqlite3GetTempRange(pParse, nArg);
      regDistinct = regAgg;
      sqlite3ExprCodeExprList(pParse, pList, regAgg, 0, SQLITE_ECEL_DUP);
    }else{
      nArg = 0;
      regAgg = 0;
    }
    if( pF->iDistinct>=0 && pList ){
      if( addrNext==0 ){
        addrNext = sqlite3VdbeMakeLabel(pParse);
      }
      pF->iDistinct = codeDistinct(pParse, eDistinctType,
          pF->iDistinct, addrNext, pList, regDistinct);
    }
    if( pF->iOBTab>=0 ){
      /* Insert a new record into the ORDER BY table */
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regAgg, regAggSz-1,
                        regAgg+regAggSz-1);
      sqlite3VdbeAddOp4Int(v, OP_IdxInsert, pF->iOBTab, regAgg+regAggSz-1,
                           regAgg, regAggSz-1);
      sqlite3ReleaseTempRange(pParse, regAgg, regAggSz);
    }else{
      /* Invoke the AggStep function */
      if( pF->pFunc->funcFlags & SQLITE_FUNC_NEEDCOLL ){
        CollSeq *pColl = 0;
        struct ExprList_item *pItem;
        int j;
        assert( pList!=0 );  /* pList!=0 if pF->pFunc has NEEDCOLL */
        for(j=0, pItem=pList->a; !pColl && j<nArg; j++, pItem++){
          pColl = sqlite3ExprCollSeq(pParse, pItem->pExpr);
        }
        if( !pColl ){
          pColl = pParse->db->pDfltColl;
        }
        if( regHit==0 && pAggInfo->nAccumulator ) regHit = ++pParse->nMem;
        sqlite3VdbeAddOp4(v, OP_CollSeq, regHit, 0, 0,
                         (char *)pColl, P4_COLLSEQ);
      }
      sqlite3VdbeAddOp3(v, OP_AggStep, 0, regAgg, AggInfoFuncReg(pAggInfo,i));
      sqlite3VdbeAppendP4(v, pF->pFunc, P4_FUNCDEF);
      sqlite3VdbeChangeP5(v, (u16)nArg);
      sqlite3ReleaseTempRange(pParse, regAgg, nArg);
    }
    if( addrNext ){
      sqlite3VdbeResolveLabel(v, addrNext);
    }
    if( pParse->nErr ) return;
  }
  if( regHit==0 && pAggInfo->nAccumulator ){
    regHit = regAcc;
  }
  if( regHit ){
    addrHitTest = sqlite3VdbeAddOp1(v, OP_If, regHit); VdbeCoverage(v);
  }
  for(i=0, pC=pAggInfo->aCol; i<pAggInfo->nAccumulator; i++, pC++){
    sqlite3ExprCode(pParse, pC->pCExpr, AggInfoColumnReg(pAggInfo,i));
    if( pParse->nErr ) return;
  }

  pAggInfo->directMode = 0;
  if( addrHitTest ){
    sqlite3VdbeJumpHereOrPopInst(v, addrHitTest);
  }
}